

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawString
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  uint uVar1;
  Mode MVar2;
  int iVar3;
  Pixel PVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  uint32_t js;
  uint32_t uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  MVar2 = this->nPixelMode;
  if (MVar2 != CUSTOM) {
    this->nPixelMode = ((uint)col.field_0 < 0xff000000) + MASK;
  }
  if (sText->_M_string_length != 0) {
    pcVar9 = (sText->_M_dataplus)._M_p;
    pcVar10 = pcVar9 + sText->_M_string_length;
    iVar13 = 0;
    iVar12 = 0;
    do {
      iVar3 = (int)*pcVar9;
      if (iVar3 == 10) {
        iVar12 = iVar12 + scale * 8;
        iVar13 = 0;
      }
      else {
        uVar1 = iVar3 - 0x11;
        if (-1 < (int)(iVar3 - 0x20U)) {
          uVar1 = iVar3 - 0x20U;
        }
        iVar3 = ((iVar3 - (uVar1 & 0xfffffff0)) + -0x20) * 8;
        iVar5 = ((int)uVar1 >> 4) * 8;
        if (scale < 2) {
          iVar8 = 0;
          do {
            iVar14 = 0;
            do {
              PVar4 = Sprite::GetPixel(this->fontSprite,iVar8 + iVar3,iVar5 + iVar14);
              if (PVar4.field_0._0_1_ != '\0') {
                (*this->_vptr_PixelGameEngine[5])
                          (this,(ulong)(uint)(x + iVar13 + iVar8),(ulong)(uint)(y + iVar12 + iVar14)
                           ,(ulong)(uint)col.field_0);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 != 8);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 8);
        }
        else {
          iVar8 = 0;
          do {
            iVar7 = 0;
            iVar14 = y + iVar12;
            do {
              PVar4 = Sprite::GetPixel(this->fontSprite,iVar3 + iVar8,iVar7 + iVar5);
              if (PVar4.field_0._0_1_ != '\0') {
                uVar6 = 0;
                do {
                  uVar11 = 0;
                  do {
                    (*this->_vptr_PixelGameEngine[5])
                              (this,(ulong)(iVar8 * scale + x + iVar13 + uVar6),
                               (ulong)(iVar14 + uVar11),(ulong)(uint)col.field_0);
                    uVar11 = uVar11 + 1;
                  } while (scale != uVar11);
                  uVar6 = uVar6 + 1;
                } while (uVar6 != scale);
              }
              iVar7 = iVar7 + 1;
              iVar14 = iVar14 + scale;
            } while (iVar7 != 8);
            iVar8 = iVar8 + 1;
          } while (iVar8 != 8);
        }
        iVar13 = iVar13 + scale * 8;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar10);
  }
  this->nPixelMode = MVar2;
  return;
}

Assistant:

void PixelGameEngine::DrawString(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;
		// Thanks @tucna, spotted bug with col.ALPHA :P
		if (m != Pixel::CUSTOM) // Thanks @Megarev, required for "shaders"
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								for (uint32_t is = 0; is < scale; is++)
									for (uint32_t js = 0; js < scale; js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (uint32_t i = 0; i < 8; i++)
						for (uint32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += 8 * scale;
			}
		}
		SetPixelMode(m);
	}